

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseNewExpr(Db *this)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  byte local_c1;
  NodeArray local_c0;
  undefined1 local_b0 [8];
  NodeArray Inits;
  Node *Init;
  size_t InitsBegin;
  Node *local_80;
  Node *Ty;
  NodeArray ExprList;
  Node *Ex;
  size_t Exprs;
  StringView local_48;
  bool local_31;
  undefined1 auStack_30 [7];
  bool IsArray;
  bool local_19;
  Db *pDStack_18;
  bool Global;
  Db *this_local;
  
  pDStack_18 = this;
  StringView::StringView((StringView *)auStack_30,"gs");
  local_19 = consumeIf(this,_auStack_30);
  cVar1 = look(this,1);
  local_31 = cVar1 == 'a';
  StringView::StringView(&local_48,"nw");
  bVar2 = consumeIf(this,local_48);
  local_c1 = 0;
  if (!bVar2) {
    StringView::StringView((StringView *)&Exprs,"na");
    bVar2 = consumeIf(this,_Exprs);
    local_c1 = bVar2 ^ 0xff;
  }
  if ((local_c1 & 1) == 0) {
    sVar3 = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
    while (bVar2 = consumeIf(this,'_'), ((bVar2 ^ 0xffU) & 1) != 0) {
      ExprList.NumElements = (size_t)parseExpr(this);
      if ((Node *)ExprList.NumElements == (Node *)0x0) {
        return (Node *)0x0;
      }
      PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                (&this->Names,(Node **)&ExprList.NumElements);
    }
    _Ty = popTrailingNodeArray(this,sVar3);
    local_80 = parseType(this);
    if (local_80 == (Node *)0x0) {
      this_local = (Db *)0x0;
    }
    else {
      StringView::StringView((StringView *)&InitsBegin,"pi");
      bVar2 = consumeIf(this,_InitsBegin);
      if (bVar2) {
        sVar3 = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::size(&this->Names);
        while (bVar2 = consumeIf(this,'E'), ((bVar2 ^ 0xffU) & 1) != 0) {
          Inits.NumElements = (size_t)parseExpr(this);
          if ((Node *)Inits.NumElements == (Node *)0x0) {
            return (Node *)0x0;
          }
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (&this->Names,(Node **)&Inits.NumElements);
        }
        _local_b0 = popTrailingNodeArray(this,sVar3);
        this_local = (Db *)(anonymous_namespace)::Db::
                           make<(anonymous_namespace)::NewExpr,(anonymous_namespace)::NodeArray&,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray&,bool&,bool&>
                                     ((Db *)this,(NodeArray *)&Ty,&local_80,(NodeArray *)local_b0,
                                      &local_19,&local_31);
      }
      else {
        bVar2 = consumeIf(this,'E');
        if (bVar2) {
          NodeArray::NodeArray(&local_c0);
          this_local = (Db *)(anonymous_namespace)::Db::
                             make<(anonymous_namespace)::NewExpr,(anonymous_namespace)::NodeArray&,(anonymous_namespace)::Node*&,(anonymous_namespace)::NodeArray,bool&,bool&>
                                       ((Db *)this,(NodeArray *)&Ty,&local_80,&local_c0,&local_19,
                                        &local_31);
        }
        else {
          this_local = (Db *)0x0;
        }
      }
    }
  }
  else {
    this_local = (Db *)0x0;
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseNewExpr() {
  bool Global = consumeIf("gs");
  bool IsArray = look(1) == 'a';
  if (!consumeIf("nw") && !consumeIf("na"))
    return nullptr;
  size_t Exprs = Names.size();
  while (!consumeIf('_')) {
    Node *Ex = parseExpr();
    if (Ex == nullptr)
      return nullptr;
    Names.push_back(Ex);
  }
  NodeArray ExprList = popTrailingNodeArray(Exprs);
  Node *Ty = parseType();
  if (Ty == nullptr)
    return Ty;
  if (consumeIf("pi")) {
    size_t InitsBegin = Names.size();
    while (!consumeIf('E')) {
      Node *Init = parseExpr();
      if (Init == nullptr)
        return Init;
      Names.push_back(Init);
    }
    NodeArray Inits = popTrailingNodeArray(InitsBegin);
    return make<NewExpr>(ExprList, Ty, Inits, Global, IsArray);
  } else if (!consumeIf('E'))
    return nullptr;
  return make<NewExpr>(ExprList, Ty, NodeArray(), Global, IsArray);
}